

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

int lest::run<1ul>(test (*specification) [1],int argc,char **argv,ostream *os)

{
  ostream *__last;
  int iVar1;
  ostream *__first;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_71;
  texts local_70;
  allocator<lest::test> local_41;
  tests local_40;
  ostream *local_28;
  ostream *os_local;
  char **argv_local;
  test (*patStack_10) [1];
  int argc_local;
  test (*specification_local) [1];
  
  local_28 = os;
  os_local = (ostream *)argv;
  argv_local._4_4_ = argc;
  patStack_10 = specification;
  std::allocator<lest::test>::allocator(&local_41);
  std::vector<lest::test,std::allocator<lest::test>>::vector<lest::test_const*,void>
            ((vector<lest::test,std::allocator<lest::test>> *)&local_40,*specification,
             specification[1],&local_41);
  __first = os_local + 8;
  __last = os_local + (long)argv_local._4_4_ * 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_71);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_70,
             (char **)__first,(char **)__last,&local_71);
  iVar1 = run(&local_40,&local_70,local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_71);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_40);
  std::allocator<lest::test>::~allocator(&local_41);
  return iVar1;
}

Assistant:

int run( test const (&specification)[N], int argc, char * argv[], std::ostream & os = std::cout )
{
    return run( tests( specification, specification + N ), texts( argv + 1, argv + argc ), os  );
}